

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

void __thiscall
amrex::FillPatchIteratorHelper::~FillPatchIteratorHelper(FillPatchIteratorHelper *this)

{
  std::
  _Rb_tree<int,_std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>,_std::_Select1st<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>,_std::allocator<amrex::Vector<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>,_std::allocator<amrex::Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>_>_>_>_>_>_>_>
  ::~_Rb_tree(&(this->m_fbid)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>,_std::_Select1st<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
  ::~_Rb_tree(&(this->m_cbox)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>,_std::_Select1st<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>,_std::allocator<amrex::Vector<amrex::Box,_std::allocator<amrex::Box>_>_>_>_>_>_>
  ::~_Rb_tree(&(this->m_fbox)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_amrex::Box>,_std::_Select1st<std::pair<const_int,_amrex::Box>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Box>_>_>
  ::~_Rb_tree(&(this->m_ba)._M_t);
  std::
  vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
  ::~vector(&(this->m_mfid).
             super_vector<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>,_std::allocator<amrex::Vector<amrex::FabArrayId,_std::allocator<amrex::FabArrayId>_>_>_>
           );
  MultiFabCopyDescriptor::~MultiFabCopyDescriptor(&this->m_mfcd);
  return;
}

Assistant:

FillPatchIteratorHelper::~FillPatchIteratorHelper () {}